

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O3

void tcu::x11::glx::checkGlxExtension(GlxDisplay *dpy,char *extName)

{
  bool bVar1;
  ostream *poVar2;
  NotSupportedError *this;
  ostringstream oss;
  char *local_1b0;
  ostream local_190;
  
  bVar1 = GlxDisplay::isGlxExtensionSupported(dpy,extName);
  if (bVar1) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::__ostream_insert<char,std::char_traits<char>>(&local_190,"GLX extension \"",0xf);
  poVar2 = std::operator<<(&local_190,extName);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" not supported",0xf);
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  NotSupportedError::NotSupportedError
            (this,local_1b0,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x112);
  __cxa_throw(this,&NotSupportedError::typeinfo,Exception::~Exception);
}

Assistant:

static void checkGlxExtension (const GlxDisplay& dpy, const char* extName)
{
	if (!dpy.isGlxExtensionSupported(extName))
	{
		ostringstream oss;
		oss << "GLX extension \"" << extName << "\" not supported";
		TCU_THROW(NotSupportedError, oss.str().c_str());
	}
}